

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManchesterAnalyzer.cpp
# Opt level: O0

void __thiscall ManchesterAnalyzer::SetupResults(ManchesterAnalyzer *this)

{
  ManchesterAnalyzerResults *this_00;
  element_type *settings;
  element_type *peVar1;
  ManchesterAnalyzer *this_local;
  
  this_00 = (ManchesterAnalyzerResults *)operator_new(0x20);
  settings = std::auto_ptr<ManchesterAnalyzerSettings>::get(&this->mSettings);
  ManchesterAnalyzerResults::ManchesterAnalyzerResults(this_00,this,settings);
  std::auto_ptr<ManchesterAnalyzerResults>::reset(&this->mResults,this_00);
  std::auto_ptr<ManchesterAnalyzerResults>::get(&this->mResults);
  Analyzer::SetAnalyzerResults((AnalyzerResults *)this);
  peVar1 = std::auto_ptr<ManchesterAnalyzerResults>::operator->(&this->mResults);
  std::auto_ptr<ManchesterAnalyzerSettings>::operator->(&this->mSettings);
  AnalyzerResults::AddChannelBubblesWillAppearOn((Channel *)peVar1);
  return;
}

Assistant:

void ManchesterAnalyzer::SetupResults()
{
    mResults.reset( new ManchesterAnalyzerResults( this, mSettings.get() ) );
    SetAnalyzerResults( mResults.get() );
    mResults->AddChannelBubblesWillAppearOn( mSettings->mInputChannel );
}